

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  undefined1 (*pauVar4) [16];
  int iVar5;
  int iVar6;
  float *pfVar7;
  float fVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar9;
  binary_op_pow op;
  __m128 _p;
  __m128 _b0;
  binary_op_pow local_95;
  int local_94;
  ulong local_90;
  Mat *local_88;
  Mat *local_80;
  Mat *local_78;
  ulong local_70;
  undefined1 local_68 [16];
  float local_58 [2];
  float afStack_50 [2];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_90 = (ulong)(uint)a->c;
  local_94 = a->h * a->w * a->d * a->elempack;
  local_80 = a;
  local_78 = b;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar2 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)local_90) {
      local_70 = 0;
      local_88 = c;
      do {
        pfVar7 = (float *)(local_80->cstep * local_70 * local_80->elemsize + (long)local_80->data);
        pauVar4 = (undefined1 (*) [16])
                  (local_88->cstep * local_70 * local_88->elemsize + (long)local_88->data);
        local_48 = *local_78->data;
        local_68 = ZEXT416((uint)local_48);
        fStack_44 = local_48;
        fStack_40 = local_48;
        fStack_3c = local_48;
        if (local_94 < 4) {
          iVar2 = 0;
        }
        else {
          iVar6 = 0;
          do {
            local_58 = *(float (*) [2])pfVar7;
            afStack_50 = *(float (*) [2])(pfVar7 + 2);
            afVar9 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                               (&local_95,(__m128 *)local_58,(__m128 *)&local_48);
            auVar1._8_4_ = extraout_XMM0_Dc;
            auVar1._0_8_ = afVar9._0_8_;
            auVar1._12_4_ = extraout_XMM0_Dd;
            *pauVar4 = auVar1;
            pfVar7 = pfVar7 + 4;
            pauVar4 = pauVar4 + 1;
            iVar2 = iVar6 + 4;
            iVar5 = iVar6 + 7;
            iVar6 = iVar2;
          } while (iVar5 < local_94);
        }
        iVar6 = local_94 - iVar2;
        if (iVar2 < local_94) {
          lVar3 = 0;
          do {
            fVar8 = powf(pfVar7[lVar3],(float)local_68._0_4_);
            *(float *)(*pauVar4 + lVar3 * 4) = fVar8;
            lVar3 = lVar3 + 1;
          } while (iVar6 != (int)lVar3);
        }
        local_70 = local_70 + 1;
      } while (local_70 != local_90);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}